

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsparser.cc
# Opt level: O2

void ctemplate_htmlparser::jsparser_buffer_slice(jsparser_ctx *js,char *output,int start,int end)

{
  char cVar1;
  
  if (end < start) {
    __assert_fail("start <= end",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/htmlparser/jsparser.cc"
                  ,0x12f,
                  "void ctemplate_htmlparser::jsparser_buffer_slice(jsparser_ctx *, char *, int, int)"
                 );
  }
  if (-1 < start) {
    __assert_fail("start < 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/htmlparser/jsparser.cc"
                  ,0x130,
                  "void ctemplate_htmlparser::jsparser_buffer_slice(jsparser_ctx *, char *, int, int)"
                 );
  }
  if (-1 < end) {
    __assert_fail("end < 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/htmlparser/jsparser.cc"
                  ,0x131,
                  "void ctemplate_htmlparser::jsparser_buffer_slice(jsparser_ctx *, char *, int, int)"
                 );
  }
  for (; start <= end; start = start + 1) {
    cVar1 = jsparser_buffer_get(js,start);
    if (cVar1 != '\0') {
      cVar1 = jsparser_buffer_get(js,start);
      *output = cVar1;
      output = output + 1;
    }
  }
  *output = '\0';
  return;
}

Assistant:

void jsparser_buffer_slice(jsparser_ctx *js, char *output, int start, int end)
{
  int pos;

  assert(start <= end);
  assert(start < 0);
  assert(end < 0);

  for (pos = start; pos <= end; ++pos) {
    char c;
    c = jsparser_buffer_get(js, pos);
    if (c != '\0') {
      *output++ = jsparser_buffer_get(js, pos);
    }
  }
  *output++ = '\0';
}